

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.cpp
# Opt level: O3

size_t __thiscall
Memory::check_memory
          (Memory *this,PatternAddressMapper *mapping,bool reproducibility_mode,bool verbose)

{
  pointer pBVar1;
  char *start;
  _Hashtable<volatile_char_*,_volatile_char_*,_std::allocator<volatile_char_*>,_std::__detail::_Identity,_std::equal_to<volatile_char_*>,_std::hash<volatile_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *__ht;
  char *end;
  size_t sVar2;
  size_t sVar3;
  long *plVar4;
  undefined1 local_c0 [8];
  unordered_set<volatile_char_*,_std::hash<volatile_char_*>,_std::equal_to<volatile_char_*>,_std::allocator<volatile_char_*>_>
  victim_rows;
  __node_base local_78 [2];
  _AllocNode<std::allocator<std::__detail::_Hash_node<volatile_char_*,_false>_>_> local_68;
  __alloc_node_gen_t __alloc_node_gen;
  undefined8 local_58;
  Memory *local_48;
  PatternAddressMapper *local_40;
  uint local_34;
  
  pBVar1 = (this->flipped_bits).super__Vector_base<BitFlip,_std::allocator<BitFlip>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->flipped_bits).super__Vector_base<BitFlip,_std::allocator<BitFlip>_>._M_impl.
      super__Vector_impl_data._M_finish != pBVar1) {
    (this->flipped_bits).super__Vector_base<BitFlip,_std::allocator<BitFlip>_>._M_impl.
    super__Vector_impl_data._M_finish = pBVar1;
  }
  local_40 = mapping;
  __ht = &PatternAddressMapper::get_victim_rows(mapping)->_M_h;
  local_68._M_h = (__hashtable_alloc *)local_c0;
  local_c0 = (undefined1  [8])0x0;
  victim_rows._M_h._M_buckets = (__buckets_ptr)__ht->_M_bucket_count;
  victim_rows._M_h._M_bucket_count = 0;
  victim_rows._M_h._M_before_begin._M_nxt = (_Hash_node_base *)__ht->_M_element_count;
  victim_rows._M_h._M_element_count = *(size_type *)&__ht->_M_rehash_policy;
  victim_rows._M_h._M_rehash_policy._0_8_ = (__ht->_M_rehash_policy)._M_next_resize;
  victim_rows._M_h._M_rehash_policy._M_next_resize = 0;
  std::
  _Hashtable<char_volatile*,char_volatile*,std::allocator<char_volatile*>,std::__detail::_Identity,std::equal_to<char_volatile*>,std::hash<char_volatile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_assign<std::_Hashtable<char_volatile*,char_volatile*,std::allocator<char_volatile*>,std::__detail::_Identity,std::equal_to<char_volatile*>,std::hash<char_volatile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<char_volatile*,false>>>>
            ((_Hashtable<char_volatile*,char_volatile*,std::allocator<char_volatile*>,std::__detail::_Identity,std::equal_to<char_volatile*>,std::hash<char_volatile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)local_68._M_h,__ht,&stack0xffffffffffffff98);
  if (verbose) {
    victim_rows._M_h._M_single_bucket = local_78;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&victim_rows._M_h._M_single_bucket,"Checking %zu victims for bit flips.",""
              );
    format_string<unsigned_long>
              ((string *)&stack0xffffffffffffff98,(string *)&victim_rows._M_h._M_single_bucket,
               (unsigned_long)victim_rows._M_h._M_before_begin._M_nxt);
    Logger::log_info((string *)&stack0xffffffffffffff98,true);
    if (local_68._M_h != (__hashtable_alloc *)&stack0xffffffffffffffa8) {
      operator_delete(local_68._M_h,local_58 + 1);
    }
    if (victim_rows._M_h._M_single_bucket != local_78) {
      operator_delete(victim_rows._M_h._M_single_bucket,
                      (ulong)((long)&(local_78[0]._M_nxt)->_M_nxt + 1));
    }
  }
  if (victim_rows._M_h._M_bucket_count == 0) {
    sVar3 = 0;
  }
  else {
    sVar3 = 0;
    local_34 = (uint)reproducibility_mode;
    plVar4 = (long *)victim_rows._M_h._M_bucket_count;
    local_48 = this;
    do {
      DRAMAddr::DRAMAddr((DRAMAddr *)&stack0xffffffffffffff98,(void *)plVar4[1]);
      DRAMAddr::add_inplace((DRAMAddr *)&stack0xffffffffffffff98,0,1,0);
      start = (char *)plVar4[1];
      end = (char *)DRAMAddr::to_virt((DRAMAddr *)&stack0xffffffffffffff98);
      sVar2 = check_memory_internal(local_48,local_40,start,end,SUB41(local_34,0),verbose);
      sVar3 = sVar3 + sVar2;
      plVar4 = (long *)*plVar4;
    } while (plVar4 != (long *)0x0);
  }
  std::
  _Hashtable<volatile_char_*,_volatile_char_*,_std::allocator<volatile_char_*>,_std::__detail::_Identity,_std::equal_to<volatile_char_*>,_std::hash<volatile_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<volatile_char_*,_volatile_char_*,_std::allocator<volatile_char_*>,_std::__detail::_Identity,_std::equal_to<volatile_char_*>,_std::hash<volatile_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_c0);
  return sVar3;
}

Assistant:

size_t Memory::check_memory(PatternAddressMapper &mapping, bool reproducibility_mode, bool verbose) {
  flipped_bits.clear();

  auto victim_rows = mapping.get_victim_rows();
  if (verbose) Logger::log_info(format_string("Checking %zu victims for bit flips.", victim_rows.size()));

  size_t sum_found_bitflips = 0;
  for (const auto &victim_row : victim_rows) {
    auto victim_dram_addr = DRAMAddr((char*)victim_row);
    victim_dram_addr.add_inplace(0, 1, 0);
    sum_found_bitflips += check_memory_internal(mapping, victim_row,
        (volatile char *) victim_dram_addr.to_virt(), reproducibility_mode, verbose);
  }
  return sum_found_bitflips;
}